

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

bool slang::syntax::BinarySequenceExprSyntax::isKind(SyntaxKind kind)

{
  if ((int)kind < 0x152) {
    if ((kind != AndSequenceExpr) && (kind != IntersectSequenceExpr)) {
      return false;
    }
  }
  else if (((kind != OrSequenceExpr) && (kind != ThroughoutSequenceExpr)) &&
          (kind != WithinSequenceExpr)) {
    return false;
  }
  return true;
}

Assistant:

bool BinarySequenceExprSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::AndSequenceExpr:
        case SyntaxKind::IntersectSequenceExpr:
        case SyntaxKind::OrSequenceExpr:
        case SyntaxKind::ThroughoutSequenceExpr:
        case SyntaxKind::WithinSequenceExpr:
            return true;
        default:
            return false;
    }
}